

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

spv_result_t
spvtools::anon_unknown_0::DisassembleTargetInstruction
          (void *user_data,spv_parsed_instruction_t *parsed_instruction)

{
  ulong uVar1;
  int iVar2;
  spv_result_t sVar3;
  
  if (user_data == (void *)0x0) {
    __assert_fail("user_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                  ,0x246,
                  "spv_result_t spvtools::(anonymous namespace)::DisassembleTargetInstruction(void *, const spv_parsed_instruction_t *)"
                 );
  }
  uVar1 = *(ulong *)((long)user_data + 0x10);
  sVar3 = SPV_SUCCESS;
  if (uVar1 == parsed_instruction->num_words) {
    if ((uVar1 != 0) &&
       (iVar2 = bcmp(*(void **)((long)user_data + 8),parsed_instruction->words,uVar1 << 2),
       iVar2 != 0)) {
      return SPV_SUCCESS;
    }
    Disassembler::HandleInstruction(*user_data,parsed_instruction);
    sVar3 = SPV_REQUESTED_TERMINATION;
  }
  return sVar3;
}

Assistant:

spv_result_t DisassembleTargetInstruction(
    void* user_data, const spv_parsed_instruction_t* parsed_instruction) {
  assert(user_data);
  auto wrapped = static_cast<WrappedDisassembler*>(user_data);
  // Check if this is the instruction we want to disassemble.
  if (wrapped->word_count() == parsed_instruction->num_words &&
      std::equal(wrapped->inst_binary(),
                 wrapped->inst_binary() + wrapped->word_count(),
                 parsed_instruction->words)) {
    // Found the target instruction. Disassemble it and signal that we should
    // stop searching so we don't output the same instruction again.
    if (auto error =
            wrapped->disassembler()->HandleInstruction(*parsed_instruction))
      return error;
    return SPV_REQUESTED_TERMINATION;
  }
  return SPV_SUCCESS;
}